

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O3

void duh_sigrenderer_set_callback
               (DUH_SIGRENDERER *sigrenderer,DUH_SIGRENDERER_CALLBACK callback,void *data)

{
  return;
}

Assistant:

void duh_sigrenderer_set_callback(
	DUH_SIGRENDERER *sigrenderer,
	DUH_SIGRENDERER_CALLBACK callback, void *data
)
{
	(void)sigrenderer;
	(void)callback;
	(void)data;
	/*fprintf(stderr,
		"Call to deprecated function duh_sigrenderer_set_callback(). The callback\n"
		"was not installed. See dumb/docs/deprec.txt for how to fix this.\n");*/
}